

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O0

node_t_conflict pre_cond_expr(c2m_ctx_t c2m_ctx)

{
  int iVar1;
  node_t_conflict pnVar2;
  undefined1 local_38 [8];
  pos_t pos;
  node_t_conflict n;
  node_t_conflict r;
  c2m_ctx_t c2m_ctx_local;
  
  c2m_ctx_local = (c2m_ctx_t)pre_lor_expr(c2m_ctx);
  if ((c2m_ctx_local != (c2m_ctx_t)0x0) &&
     (iVar1 = pre_match(c2m_ctx,0x3f,(pos_t *)local_38,(node_code_t *)0x0,(node_t_conflict *)0x0),
     iVar1 != 0)) {
    pos._8_8_ = new_pos_node1(c2m_ctx,N_COND,_local_38,(node_t_conflict)c2m_ctx_local);
    pnVar2 = pre_cond_expr(c2m_ctx);
    if (pnVar2 == (node_t_conflict)0x0) {
      c2m_ctx_local = (c2m_ctx_t)0x0;
    }
    else {
      op_append(c2m_ctx,(node_t_conflict)pos._8_8_,pnVar2);
      iVar1 = pre_match(c2m_ctx,0x3a,(pos_t *)0x0,(node_code_t *)0x0,(node_t_conflict *)0x0);
      if (iVar1 == 0) {
        c2m_ctx_local = (c2m_ctx_t)0x0;
      }
      else {
        pnVar2 = pre_cond_expr(c2m_ctx);
        if (pnVar2 == (node_t_conflict)0x0) {
          c2m_ctx_local = (c2m_ctx_t)0x0;
        }
        else {
          op_append(c2m_ctx,(node_t_conflict)pos._8_8_,pnVar2);
          c2m_ctx_local = (c2m_ctx_t)pos._8_8_;
        }
      }
    }
  }
  return (node_t_conflict)c2m_ctx_local;
}

Assistant:

static node_t pre_cond_expr (c2m_ctx_t c2m_ctx) {
  node_t r, n;
  pos_t pos;

  if ((r = pre_lor_expr (c2m_ctx)) == NULL) return r;
  if (!pre_match (c2m_ctx, '?', &pos, NULL, NULL)) return r;
  n = new_pos_node1 (c2m_ctx, N_COND, pos, r);
  if ((r = pre_cond_expr (c2m_ctx)) == NULL) return r;
  op_append (c2m_ctx, n, r);
  if (!pre_match (c2m_ctx, ':', NULL, NULL, NULL)) return NULL;
  if ((r = pre_cond_expr (c2m_ctx)) == NULL) return r;
  op_append (c2m_ctx, n, r);
  return n;
}